

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall xLearn::Reader::shrink_block(Reader *this,char *block,size_t *ret,FILE *file)

{
  long lVar1;
  FILE *in_RCX;
  long *in_RDX;
  long in_RSI;
  size_t index;
  undefined8 local_28;
  
  local_28 = *in_RDX;
  do {
    lVar1 = local_28;
    local_28 = lVar1 + -1;
  } while (*(char *)(in_RSI + local_28) != '\n');
  fseek(in_RCX,(local_28 - *in_RDX) + 1,1);
  *in_RDX = lVar1;
  return;
}

Assistant:

void Reader::shrink_block(char* block, size_t* ret, FILE* file) {
  // Find the last '\n'
  size_t index = *ret-1;
  while (block[index] != '\n') { index--; }
  // Shrink back file pointer
  fseek(file, index-*ret+1, SEEK_CUR);
  // The real size of block
  *ret = index + 1;
}